

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsScissorTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::Functional::anon_unknown_0::ScissorClearCase::render
          (ScissorClearCase *this,GLuint program,IVec4 *param_2)

{
  code *pcVar1;
  undefined8 gl_00;
  undefined4 uVar2;
  float extraout_var;
  float *pfVar3;
  Vector<float,_3> local_50;
  Vector<float,_3> local_44;
  undefined1 local_38 [8];
  Vec4 white;
  Functions *gl;
  IVec4 *param_2_local;
  GLuint program_local;
  ScissorClearCase *this_local;
  
  white.m_data[2] = (float)(*((this->super_ScissorCase).m_renderCtx)->_vptr_RenderContext[3])();
  white.m_data[3] = extraout_var;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_38,1.0,1.0,1.0,1.0);
  (**(code **)(white.m_data._8_8_ + 0x1c0))(0x3f19999a,0x3dcccccd,0x3dcccccd,0x3f800000);
  (**(code **)(white.m_data._8_8_ + 0x1d0))(0);
  if ((this->m_clearMode & 0x100) != 0) {
    (**(code **)(white.m_data._8_8_ + 0x5e0))(0xb71);
    (**(code **)(white.m_data._8_8_ + 0x4a0))(0x204);
  }
  if ((this->m_clearMode & 0x400) != 0) {
    (**(code **)(white.m_data._8_8_ + 0x208))(0x7b);
    (**(code **)(white.m_data._8_8_ + 0x5e0))(0xb90);
    (**(code **)(white.m_data._8_8_ + 0x12c8))(0x202,0x7b,0xffffffff);
  }
  if ((this->m_clearMode & 0x4000) != 0) {
    (**(code **)(white.m_data._8_8_ + 0x1c0))(0x3dcccccd,0x3f19999a,0x3dcccccd,0x3f800000);
  }
  (**(code **)(white.m_data._8_8_ + 0x188))(this->m_clearMode);
  (**(code **)(white.m_data._8_8_ + 0x4e8))(0xc11);
  pcVar1 = *(code **)(white.m_data._8_8_ + 0x15a8);
  uVar2 = (**(code **)(white.m_data._8_8_ + 0xb48))(program,"u_color");
  pfVar3 = tcu::Vector<float,_4>::getPtr((Vector<float,_4> *)local_38);
  (*pcVar1)(uVar2,1,pfVar3);
  gl_00 = white.m_data._8_8_;
  if ((this->m_clearMode & 0x4000) == 0) {
    tcu::Vector<float,_3>::Vector(&local_44,-1.0,-1.0,0.5);
    tcu::Vector<float,_3>::Vector(&local_50,1.0,1.0,0.5);
    drawQuad((Functions *)gl_00,program,&local_44,&local_50);
  }
  (**(code **)(white.m_data._8_8_ + 0x4e8))(0xb71);
  (**(code **)(white.m_data._8_8_ + 0x4e8))(0xb90);
  return;
}

Assistant:

void ScissorClearCase::render (GLuint program, const IVec4&) const
{
	const glw::Functions&	gl		= m_renderCtx.getFunctions();
	const Vec4				white	(1.0f, 1.0f, 1.0f, 1.0);

	gl.clearColor(0.6f, 0.1f, 0.1f, 1.0);
	gl.clearDepthf(0.0f);

	if (m_clearMode & GL_DEPTH_BUFFER_BIT)
	{
		gl.enable(GL_DEPTH_TEST);
		gl.depthFunc(GL_GREATER);
	}

	if (m_clearMode & GL_STENCIL_BUFFER_BIT)
	{
		gl.clearStencil(123);
		gl.enable(GL_STENCIL_TEST);
		gl.stencilFunc(GL_EQUAL, 123, ~0u);
	}

	if (m_clearMode & GL_COLOR_BUFFER_BIT)
		gl.clearColor(0.1f, 0.6f, 0.1f, 1.0);

	gl.clear(m_clearMode);
	gl.disable(GL_SCISSOR_TEST);

	gl.uniform4fv(gl.getUniformLocation(program, "u_color"), 1, white.getPtr());

	if (!(m_clearMode & GL_COLOR_BUFFER_BIT))
		drawQuad(gl, program, Vec3(-1.0f, -1.0f, 0.5f), Vec3(1.0f, 1.0f, 0.5f));

	gl.disable(GL_DEPTH_TEST);
	gl.disable(GL_STENCIL_TEST);
}